

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12c79ba::MonochromeRealtimeTest_TestMonochromeEncoding_Test::TestBody
          (MonochromeRealtimeTest_TestMonochromeEncoding_Test *this)

{
  EncoderTest *pEVar1;
  bool bVar2;
  pointer *__ptr;
  SEARCH_METHODS *message;
  pointer lhs;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int initial_chroma_value;
  AssertHelper local_98;
  I420VideoSource video;
  
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_c8);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,0x1e);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.init_flags_ = 0x10000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.monochrome = 1;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_target_bitrate
       = 0x28;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_sz = 6000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_initial_sz
       = 4000;
  (this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest.cfg_.rc_buf_optimal_sz
       = 5000;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      pEVar1 = &(this->super_MonochromeRealtimeTest).super_MonochromeTest.super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == false) {
      lhs = (this->super_MonochromeRealtimeTest).super_MonochromeTest.chroma_value_list_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
      initial_chroma_value = *lhs;
      for (; lhs != (this->super_MonochromeRealtimeTest).super_MonochromeTest.chroma_value_list_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish; lhs = lhs + 1) {
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_fatal_failure_checker,"*iter","initial_chroma_value",lhs,
                   &initial_chroma_value);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c8);
          message = "";
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
            message = *(SEARCH_METHODS **)
                       CONCAT71(gtest_fatal_failure_checker._9_7_,
                                gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/monochrome_test.cc"
                     ,0xcd,(char *)message);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if (local_c8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      goto LAB_005e3adc;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/monochrome_test.cc"
             ,0xc5,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005e3adc:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(MonochromeRealtimeTest, TestMonochromeEncoding) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 30);
  init_flags_ = AOM_CODEC_USE_PSNR;
  // Set monochrome encoding flag
  cfg_.monochrome = 1;
  // Run at low bitrate.
  cfg_.rc_target_bitrate = 40;
  cfg_.rc_buf_sz = 6000;
  cfg_.rc_buf_initial_sz = 4000;
  cfg_.rc_buf_optimal_sz = 5000;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check that the chroma planes are equal across all frames
  std::vector<int>::const_iterator iter = chroma_value_list_.begin();
  int initial_chroma_value = *iter;
  for (; iter != chroma_value_list_.end(); ++iter) {
    // Check that all decoded frames have the same constant chroma planes.
    EXPECT_EQ(*iter, initial_chroma_value);
  }
#endif
}